

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.h
# Opt level: O1

bool __thiscall
lzham::task_pool::
queue_multiple_object_tasks<lzham::lzcompressor,void(lzham::lzcompressor::*)(unsigned_long_long,void*)>
          (task_pool *this,lzcompressor *pObject,offset_in_lzcompressor_to_subr pObject_method,
          uint64 first_data,uint num_tasks,void *pData_ptr)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  task_callback_func p_Var4;
  bool bVar5;
  undefined4 in_register_00000084;
  long lVar6;
  task_callback_func p_Var7;
  ulong uVar8;
  ulong uVar9;
  void *in_stack_00000008;
  
  if ((int)pData_ptr == 0) {
    bVar5 = true;
  }
  else {
    bVar5 = true;
    uVar8 = 0;
    do {
      p_Var4 = (task_callback_func)lzham_malloc(0x28,(size_t *)0x0);
      p_Var7 = (task_callback_func)0x0;
      if (p_Var4 != (task_callback_func)0x0) {
        *(undefined ***)p_Var4 = &PTR_execute_task_00127d60;
        *(lzcompressor **)(p_Var4 + 8) = pObject;
        *(offset_in_lzcompressor_to_subr *)(p_Var4 + 0x10) = pObject_method;
        *(uint64 *)(p_Var4 + 0x18) = first_data;
        *(undefined4 *)(p_Var4 + 0x20) = 1;
        p_Var7 = p_Var4;
      }
      if (p_Var7 == (task_callback_func)0x0) {
        bVar5 = false;
        bVar1 = false;
      }
      else {
        iVar2 = pthread_spin_lock((pthread_spinlock_t *)this);
        if (iVar2 != 0) {
          lzham_fail("\"spinlock: pthread_spin_lock() failed\"",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/comp/lzham_pthreads_threading.h"
                     ,0x72);
        }
        iVar2 = (this->m_task_stack).m_top;
        lVar6 = (long)iVar2;
        bVar1 = lVar6 < 0x10;
        if (lVar6 < 0x10) {
          (this->m_task_stack).m_top = iVar2 + 1;
          (this->m_task_stack).m_stack[lVar6].m_data =
               CONCAT44(in_register_00000084,num_tasks) + uVar8;
          (this->m_task_stack).m_stack[lVar6].m_pData_ptr = in_stack_00000008;
          (this->m_task_stack).m_stack[lVar6].field_2.m_callback = p_Var7;
          (this->m_task_stack).m_stack[lVar6].m_flags = 1;
        }
        iVar3 = pthread_spin_unlock((pthread_spinlock_t *)this);
        if (iVar3 != 0) {
          lzham_fail("\"spinlock: pthread_spin_unlock() failed\"",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/comp/lzham_pthreads_threading.h"
                     ,0x7a);
        }
        if (0xf < iVar2) {
          bVar5 = false;
        }
      }
      uVar9 = uVar8;
    } while ((bVar1) &&
            (uVar8 = uVar8 + 1, uVar9 = (ulong)pData_ptr & 0xffffffff,
            ((ulong)pData_ptr & 0xffffffff) != uVar8));
    if ((int)uVar9 != 0) {
      LOCK();
      this->m_num_outstanding_tasks = this->m_num_outstanding_tasks + (uVar9 & 0xffffffff);
      UNLOCK();
      lVar6 = (uVar9 & 0xffffffff) + 1;
      do {
        iVar2 = sem_post((sem_t *)&this->m_tasks_available);
        if (iVar2 != 0) {
          lzham_fail("\"semaphore: sem_post() or sem_post_multiple() failed\"",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/raedwulf[P]liblzham/src/comp/lzham_pthreads_threading.h"
                     ,0x3b);
          return bVar5;
        }
        lVar6 = lVar6 + -1;
      } while (1 < lVar6);
    }
  }
  return bVar5;
}

Assistant:

inline bool task_pool::queue_multiple_object_tasks(S* pObject, T pObject_method, uint64 first_data, uint num_tasks, void* pData_ptr)
   {
      LZHAM_ASSERT(m_num_threads);
      LZHAM_ASSERT(pObject);
      LZHAM_ASSERT(num_tasks);
      if (!num_tasks)
         return true;

      bool status = true;

      uint i;
      for (i = 0; i < num_tasks; i++)
      {
         task tsk;

         tsk.m_pObj = lzham_new< object_task<S> >(pObject, pObject_method, cObjectTaskFlagDeleteAfterExecution);
         if (!tsk.m_pObj)
         {
            status = false;
            break;
         }

         tsk.m_data = first_data + i;
         tsk.m_pData_ptr = pData_ptr;
         tsk.m_flags = cTaskFlagObject;

         if (!m_task_stack.try_push(tsk))
         {
            status = false;
            break;
         }
      }

      if (i)
      {
         atomic_add32(&m_num_outstanding_tasks, i);

         m_tasks_available.release(i);
      }

      return status;
   }